

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcode.cpp
# Opt level: O3

char * jh_get_lexeme(char *b,int *type)

{
  int iVar1;
  int iVar2;
  char cVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  int curr_vec [2];
  int local_40;
  int local_3c;
  int *local_38;
  
  cVar3 = *b;
  local_38 = type;
  if (cVar3 == '\0') {
    iVar2 = -1;
    pcVar4 = b;
  }
  else {
    iVar6 = 1;
    iVar5 = 1;
    pcVar8 = b;
    iVar7 = -1;
    do {
      iVar6 = *(int *)(*(long *)&((jh_dtrans.
                                   super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[iVar6].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + (long)cVar3 * 4);
      iVar5 = *(int *)(*(long *)&jh_dtrans.
                                 super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar5].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + (long)cVar3 * 4);
      local_40 = iVar6;
      local_3c = iVar5;
      iVar1 = jh_detect_type(&local_40);
      pcVar4 = b;
      iVar2 = iVar1;
      if ((iVar1 < 0) && (pcVar4 = pcVar8, iVar2 = iVar7, iVar1 == -1)) break;
      cVar3 = b[1];
      b = b + 1;
      pcVar8 = pcVar4;
      iVar7 = iVar2;
    } while (cVar3 != '\0');
  }
  *local_38 = iVar2;
  return pcVar4 + 1;
}

Assistant:

char *jh_get_lexeme(char *b, int *type) {
    int curr_vec[jh_type_cnt];
    char *f = b, *old_f = b;
    int old_type = -1, new_type = -1;
    for (int &i : curr_vec)
        i = 1;
    while(*f != '\0') {
        jh_update_vec(curr_vec, *f);
        new_type = jh_detect_type(curr_vec);
        if (new_type >= 0) {
            old_type = new_type;
            old_f = f;
        } else if (new_type == -1) {
            *type = old_type;
            return old_f + 1;
        }
        ++f;
    }
    *type = old_type;
    return old_f + 1;
}